

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

int Gia_ManCoLargestSupp(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  uVar4 = (ulong)p->vCos->nSize;
  if ((long)uVar4 < 1) {
    iVar2 = -1;
  }
  else {
    iVar5 = -1;
    lVar6 = 1;
    uVar7 = 0;
    uVar3 = 0xffffffff;
    do {
      iVar2 = p->vCos->pArray[uVar7];
      if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return (int)uVar3;
      }
      if ((long)vSupps->nSize <= (long)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar1 = (&vSupps->pArray->nCap)[lVar6];
      if (iVar5 < iVar1) {
        uVar3 = uVar7 & 0xffffffff;
      }
      iVar2 = (int)uVar3;
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 4;
    } while (uVar4 != uVar7);
  }
  return iVar2;
}

Assistant:

int Gia_ManCoLargestSupp( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vSuppOne;
    int i, iCoMax = -1, nSuppMax = -1;
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( nSuppMax < Vec_IntSize(vSuppOne) )
        {
            nSuppMax = Vec_IntSize(vSuppOne);
            iCoMax = i;
        }
    }
    return iCoMax;
}